

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

void ctemplate_htmlparser::htmlparser_reset(htmlparser_ctx *ctx)

{
  if (ctx != (htmlparser_ctx *)0x0) {
    htmlparser_reset_mode(ctx,0);
    return;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x2b2,"void ctemplate_htmlparser::htmlparser_reset(htmlparser_ctx *)");
}

Assistant:

void htmlparser_reset(htmlparser_ctx *ctx)
{
    assert(ctx != NULL);
    htmlparser_reset_mode(ctx, HTMLPARSER_MODE_HTML);
}